

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O0

void __thiscall
HBT_correlation::create_a_2D_array<double>(HBT_correlation *this,double ***arr2D,int nx,int ny)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int i;
  undefined4 local_1c;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_EDX;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  *in_RSI = (long)pvVar4;
  for (local_1c = 0; local_1c < in_EDX; local_1c = local_1c + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)in_ECX;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    *(void **)(*in_RSI + (long)local_1c * 8) = pvVar4;
  }
  return;
}

Assistant:

void HBT_correlation::create_a_2D_array(T **&arr2D, int nx, int ny) {
    arr2D = new T *[nx];
    for (int i = 0; i < nx; i++) {
        arr2D[i] = new T[ny];
    }
}